

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O0

void bssl::anon_unknown_12::VerifyExtendedKeyUsage
               (ParsedCertificate *cert,KeyPurpose required_key_purpose,CertErrors *errors,
               bool is_target_cert,bool is_target_cert_issuer)

{
  Input lhs;
  Input lhs_00;
  Input lhs_01;
  Input lhs_02;
  Input lhs_03;
  Input lhs_04;
  Input lhs_05;
  Input lhs_06;
  Input lhs_07;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint8_t uVar9;
  bool bVar10;
  bool bVar11;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *this;
  BitString *pBVar12;
  size_t sVar13;
  undefined1 local_228 [8];
  anon_class_16_2_fb8ee566 add_error_if_strict;
  Span<const_unsigned_char> local_208;
  Span<const_unsigned_char> local_1f8;
  uchar *local_1e8;
  size_t local_1e0;
  Span<const_unsigned_char> local_1d8;
  Span<const_unsigned_char> local_1c8;
  uchar *local_1b8;
  size_t local_1b0;
  Span<const_unsigned_char> local_1a8;
  Span<const_unsigned_char> local_198;
  uchar *local_188;
  size_t local_180;
  Span<const_unsigned_char> local_178;
  Span<const_unsigned_char> local_168;
  uchar *local_158;
  size_t local_150;
  Span<const_unsigned_char> local_148;
  Span<const_unsigned_char> local_138;
  uchar *local_128;
  size_t local_120;
  Span<const_unsigned_char> local_118;
  Span<const_unsigned_char> local_108;
  uchar *local_f8;
  size_t local_f0;
  Span<const_unsigned_char> local_e8;
  Span<const_unsigned_char> local_d8;
  uchar *local_c8;
  size_t local_c0;
  Span<const_unsigned_char> local_b8;
  Span<const_unsigned_char> local_a8;
  uchar *local_98;
  size_t local_90;
  Span<const_unsigned_char> local_88;
  Span<const_unsigned_char> local_78;
  uchar *local_68;
  size_t local_60;
  reference local_58;
  Input *key_purpose_oid;
  const_iterator __end3;
  const_iterator __begin3;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *__range3;
  size_t eku_oid_count;
  bool has_email_protection_eku;
  bool has_document_signing_eku;
  bool has_rcs_mls_client_eku;
  bool has_ocsp_signing_eku;
  bool has_time_stamping_eku;
  bool has_code_signing_eku;
  bool has_client_auth_eku;
  bool has_server_auth_eku;
  bool has_any_eku;
  bool is_target_cert_issuer_local;
  bool is_target_cert_local;
  CertErrors *errors_local;
  ParsedCertificate *pPStack_10;
  KeyPurpose required_key_purpose_local;
  ParsedCertificate *cert_local;
  
  if (required_key_purpose == ANY_EKU) {
    return;
  }
  bVar10 = false;
  bVar5 = false;
  bVar6 = false;
  bVar4 = false;
  bVar3 = false;
  bVar8 = false;
  bVar11 = false;
  bVar1 = false;
  bVar2 = false;
  __range3 = (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)0x0;
  _has_ocsp_signing_eku = errors;
  errors_local._4_4_ = required_key_purpose;
  pPStack_10 = cert;
  bVar7 = ParsedCertificate::has_extended_key_usage(cert);
  if (bVar7) {
    this = ParsedCertificate::extended_key_usage(pPStack_10);
    __end3 = ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::begin(this);
    key_purpose_oid =
         (Input *)::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::end(this);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
                                       *)&key_purpose_oid), bVar7) {
      local_58 = __gnu_cxx::
                 __normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
                 ::operator*(&__end3);
      __range3 = (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
                 ((long)&(__range3->
                         super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1);
      local_68 = (local_58->data_).data_;
      local_60 = (local_58->data_).size_;
      Span<unsigned_char_const>::Span<4ul>
                ((Span<unsigned_char_const> *)&local_88,(uchar (*) [4])&kAnyEKU);
      bssl::der::Input::Input((Input *)&local_78,local_88);
      lhs_07.data_.size_ = local_60;
      lhs_07.data_.data_ = local_68;
      bVar7 = bssl::der::operator==(lhs_07,(Input)local_78);
      if (bVar7) {
        bVar10 = true;
      }
      local_98 = (local_58->data_).data_;
      local_90 = (local_58->data_).size_;
      Span<unsigned_char_const>::Span<8ul>
                ((Span<unsigned_char_const> *)&local_b8,(uchar (*) [8])&kServerAuth);
      bssl::der::Input::Input((Input *)&local_a8,local_b8);
      lhs_06.data_.size_ = local_90;
      lhs_06.data_.data_ = local_98;
      bVar7 = bssl::der::operator==(lhs_06,(Input)local_a8);
      if (bVar7) {
        bVar5 = true;
      }
      local_c8 = (local_58->data_).data_;
      local_c0 = (local_58->data_).size_;
      Span<unsigned_char_const>::Span<8ul>
                ((Span<unsigned_char_const> *)&local_e8,(uchar (*) [8])&kClientAuth);
      bssl::der::Input::Input((Input *)&local_d8,local_e8);
      lhs_05.data_.size_ = local_c0;
      lhs_05.data_.data_ = local_c8;
      bVar7 = bssl::der::operator==(lhs_05,(Input)local_d8);
      if (bVar7) {
        bVar6 = true;
      }
      local_f8 = (local_58->data_).data_;
      local_f0 = (local_58->data_).size_;
      Span<unsigned_char_const>::Span<8ul>
                ((Span<unsigned_char_const> *)&local_118,(uchar (*) [8])&kCodeSigning);
      bssl::der::Input::Input((Input *)&local_108,local_118);
      lhs_04.data_.size_ = local_f0;
      lhs_04.data_.data_ = local_f8;
      bVar7 = bssl::der::operator==(lhs_04,(Input)local_108);
      if (bVar7) {
        bVar4 = true;
      }
      local_128 = (local_58->data_).data_;
      local_120 = (local_58->data_).size_;
      Span<unsigned_char_const>::Span<8ul>
                ((Span<unsigned_char_const> *)&local_148,(uchar (*) [8])&kTimeStamping);
      bssl::der::Input::Input((Input *)&local_138,local_148);
      lhs_03.data_.size_ = local_120;
      lhs_03.data_.data_ = local_128;
      bVar7 = bssl::der::operator==(lhs_03,(Input)local_138);
      if (bVar7) {
        bVar3 = true;
      }
      local_158 = (local_58->data_).data_;
      local_150 = (local_58->data_).size_;
      Span<unsigned_char_const>::Span<8ul>
                ((Span<unsigned_char_const> *)&local_178,(uchar (*) [8])&kOCSPSigning);
      bssl::der::Input::Input((Input *)&local_168,local_178);
      lhs_02.data_.size_ = local_150;
      lhs_02.data_.data_ = local_158;
      bVar7 = bssl::der::operator==(lhs_02,(Input)local_168);
      if (bVar7) {
        bVar8 = true;
      }
      local_188 = (local_58->data_).data_;
      local_180 = (local_58->data_).size_;
      Span<unsigned_char_const>::Span<6ul>
                ((Span<unsigned_char_const> *)&local_1a8,(uchar (*) [6])&kRcsMlsClient);
      bssl::der::Input::Input((Input *)&local_198,local_1a8);
      lhs_01.data_.size_ = local_180;
      lhs_01.data_.data_ = local_188;
      bVar7 = bssl::der::operator==(lhs_01,(Input)local_198);
      if (bVar7) {
        bVar11 = true;
      }
      local_1b8 = (local_58->data_).data_;
      local_1b0 = (local_58->data_).size_;
      Span<unsigned_char_const>::Span<8ul>
                ((Span<unsigned_char_const> *)&local_1d8,(uchar (*) [8])&kEmailProtection);
      bssl::der::Input::Input((Input *)&local_1c8,local_1d8);
      lhs_00.data_.size_ = local_1b0;
      lhs_00.data_.data_ = local_1b8;
      bVar7 = bssl::der::operator==(lhs_00,(Input)local_1c8);
      if (bVar7) {
        bVar2 = true;
      }
      local_1e8 = (local_58->data_).data_;
      local_1e0 = (local_58->data_).size_;
      Span<unsigned_char_const>::Span<8ul>
                ((Span<unsigned_char_const> *)&local_208,(uchar (*) [8])&kDocumentSigning);
      bssl::der::Input::Input((Input *)&local_1f8,local_208);
      lhs.data_.size_ = local_1e0;
      lhs.data_.data_ = local_1e8;
      bVar7 = bssl::der::operator==(lhs,(Input)local_1f8);
      if (bVar7) {
        bVar1 = true;
      }
      __gnu_cxx::
      __normal_iterator<const_bssl::der::Input_*,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>
      ::operator++(&__end3);
    }
  }
  if (errors_local._4_4_ == RCS_MLS_CLIENT_AUTH) {
    bVar10 = false;
    if (is_target_cert) {
      bVar8 = ParsedCertificate::has_key_usage(pPStack_10);
      bVar10 = true;
      if (bVar8) {
        pBVar12 = ParsedCertificate::key_usage(pPStack_10);
        bVar8 = bssl::der::BitString::AssertsBit(pBVar12,0);
        bVar10 = true;
        if (bVar8) {
          pBVar12 = ParsedCertificate::key_usage(pPStack_10);
          join_0x00000010_0x00000000_ =
               (Span<const_unsigned_char>)bssl::der::BitString::bytes(pBVar12);
          sVar13 = bssl::der::Input::size((Input *)&add_error_if_strict.errors);
          bVar10 = true;
          if (sVar13 == 1) {
            pBVar12 = ParsedCertificate::key_usage(pPStack_10);
            uVar9 = bssl::der::BitString::unused_bits(pBVar12);
            bVar10 = uVar9 != '\a';
          }
        }
      }
    }
    if (bVar10) {
      CertErrors::AddError
                (_has_ocsp_signing_eku,
                 "KeyUsage must have only the digitalSignature bit set for rcsMlsClient auth");
    }
    bVar10 = ParsedCertificate::has_extended_key_usage(pPStack_10);
    if (!bVar10) {
      CertErrors::AddError(_has_ocsp_signing_eku,"Certificate does not have extended key usage");
      return;
    }
    if ((__range3 == (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)0x1) && (bVar11)
       ) {
      return;
    }
    CertErrors::AddError
              (_has_ocsp_signing_eku,
               "The extended key usage does not contain only the rcsMlsClient key purpose.");
    return;
  }
  if (errors_local._4_4_ == C2PA_TIMESTAMPING) {
    if (!is_target_cert) {
      return;
    }
    bVar11 = ParsedCertificate::has_extended_key_usage(pPStack_10);
    if (!bVar11) {
      CertErrors::AddError(_has_ocsp_signing_eku,"Certificate does not have extended key usage");
    }
    if ((((!bVar10) && (!bVar8)) && (!bVar1)) && ((!bVar2 && (bVar3)))) {
      return;
    }
    CertErrors::AddError
              (_has_ocsp_signing_eku,
               "The extended key usage does not contain the time stamping key purpose, or contains prohibited key usages"
              );
    return;
  }
  if (errors_local._4_4_ == C2PA_MANIFEST) {
    if (!is_target_cert) {
      return;
    }
    bVar11 = ParsedCertificate::has_extended_key_usage(pPStack_10);
    if (!bVar11) {
      CertErrors::AddError(_has_ocsp_signing_eku,"Certificate does not have extended key usage");
    }
    bVar11 = ParsedCertificate::has_key_usage(pPStack_10);
    if (bVar11) {
      pBVar12 = ParsedCertificate::key_usage(pPStack_10);
      bVar11 = bssl::der::BitString::AssertsBit(pBVar12,0);
      if (((bVar11) && (!bVar10)) && ((!bVar8 && (!bVar3)))) {
        if (bVar2) {
          return;
        }
        if (bVar1) {
          return;
        }
      }
    }
    CertErrors::AddError
              (_has_ocsp_signing_eku,
               "The extended key usage must contain at least one of: email protection or document signing, and must not contain prohibited key usages"
              );
    return;
  }
  if (errors_local._4_4_ == CLIENT_AUTH_STRICT_LEAF) {
    if (is_target_cert) {
      errors_local._4_4_ = CLIENT_AUTH_STRICT;
    }
    else {
      errors_local._4_4_ = CLIENT_AUTH;
    }
  }
  if (errors_local._4_4_ == SERVER_AUTH_STRICT_LEAF) {
    if (is_target_cert) {
      errors_local._4_4_ = SERVER_AUTH_STRICT;
    }
    else {
      errors_local._4_4_ = SERVER_AUTH;
    }
  }
  local_228 = (undefined1  [8])((long)&errors_local + 4);
  add_error_if_strict.required_key_purpose = (KeyPurpose *)&has_ocsp_signing_eku;
  if (is_target_cert) {
    bVar11 = ParsedCertificate::has_extended_key_usage(pPStack_10);
    if (bVar11) {
      if (bVar4) {
        VerifyExtendedKeyUsage::anon_class_16_2_fb8ee566::operator()
                  ((anon_class_16_2_fb8ee566 *)local_228,
                   "The extended key usage includes code signing which is not permitted for this use"
                  );
      }
      if (bVar8) {
        VerifyExtendedKeyUsage::anon_class_16_2_fb8ee566::operator()
                  ((anon_class_16_2_fb8ee566 *)local_228,
                   "The extended key usage includes OCSP signing which is not permitted for this use"
                  );
      }
      if (bVar3) {
        VerifyExtendedKeyUsage::anon_class_16_2_fb8ee566::operator()
                  ((anon_class_16_2_fb8ee566 *)local_228,
                   "The extended key usage includes time stamping which is not permitted for this use"
                  );
      }
    }
    else {
      CertErrors::AddWarning(_has_ocsp_signing_eku,"Certificate does not have extended key usage");
    }
  }
  else if ((is_target_cert_issuer) &&
          (bVar11 = ParsedCertificate::has_extended_key_usage(pPStack_10), bVar11)) {
    if (bVar4) {
      VerifyExtendedKeyUsage::anon_class_16_2_fb8ee566::operator()
                ((anon_class_16_2_fb8ee566 *)local_228,
                 "The extended key usage includes code signing which is not permitted for this use")
      ;
    }
    if (bVar3) {
      VerifyExtendedKeyUsage::anon_class_16_2_fb8ee566::operator()
                ((anon_class_16_2_fb8ee566 *)local_228,
                 "The extended key usage includes time stamping which is not permitted for this use"
                );
    }
  }
  if (errors_local._4_4_ == ANY_EKU) goto LAB_00616326;
  if (errors_local._4_4_ == SERVER_AUTH) {
LAB_00616345:
    if ((bVar10) && (!bVar5)) {
      if ((is_target_cert) || (is_target_cert_issuer)) {
        CertErrors::AddWarning
                  (_has_ocsp_signing_eku,
                   "The extended key usage does not include server auth but instead includes anyExtendeKeyUsage"
                  );
      }
      else {
        bVar5 = true;
      }
    }
    if ((is_target_cert_issuer) &&
       (bVar11 = ParsedCertificate::has_extended_key_usage(pPStack_10), !bVar11)) {
      bVar5 = true;
    }
    if (errors_local._4_4_ == SERVER_AUTH) {
      bVar11 = ParsedCertificate::has_extended_key_usage(pPStack_10);
      if (((bVar11) && (!bVar5)) && (!bVar10)) {
        CertErrors::AddError
                  (_has_ocsp_signing_eku,"The extended key usage does not include server auth");
      }
    }
    else if (!bVar5) {
      CertErrors::AddError
                (_has_ocsp_signing_eku,"The extended key usage does not include server auth");
    }
  }
  else {
    if (errors_local._4_4_ != CLIENT_AUTH) {
      if (errors_local._4_4_ == SERVER_AUTH_STRICT) goto LAB_00616345;
      if (errors_local._4_4_ == SERVER_AUTH_STRICT_LEAF) {
LAB_00616326:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                      ,0x1a6,
                      "void bssl::(anonymous namespace)::VerifyExtendedKeyUsage(const ParsedCertificate &, KeyPurpose, CertErrors *, bool, bool)"
                     );
      }
      if (errors_local._4_4_ != CLIENT_AUTH_STRICT) {
        if (3 < errors_local._4_4_ - CLIENT_AUTH_STRICT_LEAF) {
          return;
        }
        goto LAB_00616326;
      }
    }
    if ((bVar10) && (!bVar6)) {
      if ((is_target_cert) || (is_target_cert_issuer)) {
        CertErrors::AddWarning
                  (_has_ocsp_signing_eku,
                   "The extended key usage does not include client auth but instead includes anyExtendedKeyUsage"
                  );
      }
      else {
        bVar6 = true;
      }
    }
    if (errors_local._4_4_ == CLIENT_AUTH) {
      bVar11 = ParsedCertificate::has_extended_key_usage(pPStack_10);
      if (((bVar11) && (!bVar6)) && (!bVar10)) {
        CertErrors::AddError
                  (_has_ocsp_signing_eku,"The extended key usage does not include client auth");
      }
    }
    else if (!bVar6) {
      CertErrors::AddError
                (_has_ocsp_signing_eku,"The extended key usage does not include client auth");
    }
  }
  return;
}

Assistant:

void VerifyExtendedKeyUsage(const ParsedCertificate &cert,
                            KeyPurpose required_key_purpose, CertErrors *errors,
                            bool is_target_cert, bool is_target_cert_issuer) {
  // We treat a required KeyPurpose of ANY_EKU to mean "Do not check EKU"
  if (required_key_purpose == KeyPurpose::ANY_EKU) {
    return;
  }
  bool has_any_eku = false;
  bool has_server_auth_eku = false;
  bool has_client_auth_eku = false;
  bool has_code_signing_eku = false;
  bool has_time_stamping_eku = false;
  bool has_ocsp_signing_eku = false;
  bool has_rcs_mls_client_eku = false;
  bool has_document_signing_eku = false;
  bool has_email_protection_eku = false;
  size_t eku_oid_count = 0;
  if (cert.has_extended_key_usage()) {
    for (const auto &key_purpose_oid : cert.extended_key_usage()) {
      eku_oid_count++;
      if (key_purpose_oid == der::Input(kAnyEKU)) {
        has_any_eku = true;
      }
      if (key_purpose_oid == der::Input(kServerAuth)) {
        has_server_auth_eku = true;
      }
      if (key_purpose_oid == der::Input(kClientAuth)) {
        has_client_auth_eku = true;
      }
      if (key_purpose_oid == der::Input(kCodeSigning)) {
        has_code_signing_eku = true;
      }
      if (key_purpose_oid == der::Input(kTimeStamping)) {
        has_time_stamping_eku = true;
      }
      if (key_purpose_oid == der::Input(kOCSPSigning)) {
        has_ocsp_signing_eku = true;
      }
      if (key_purpose_oid == der::Input(kRcsMlsClient)) {
        has_rcs_mls_client_eku = true;
      }
      if (key_purpose_oid == der::Input(kEmailProtection)) {
        has_email_protection_eku = true;
      }
      if (key_purpose_oid == der::Input(kDocumentSigning)) {
        has_document_signing_eku = true;
      }
    }
  }

  if (required_key_purpose == KeyPurpose::RCS_MLS_CLIENT_AUTH) {
    // Enforce the key usage restriction for a leaf from section A.3.8.3 here
    // as well.
    if (is_target_cert &&
        (!cert.has_key_usage() ||
         // This works to enforce that digital signature is the only bit because
         // digital signature is bit 0.
         !cert.key_usage().AssertsBit(KEY_USAGE_BIT_DIGITAL_SIGNATURE) ||
         cert.key_usage().bytes().size() != 1 ||
         cert.key_usage().unused_bits() != 7)) {
      errors->AddError(cert_errors::kKeyUsageIncorrectForRcsMlsClient);
    }
    // Rules for MLS client auth. For the leaf and all intermediates, EKU must
    // be present and have exactly one EKU which is rcsMlsClient.
    if (!cert.has_extended_key_usage()) {
      errors->AddError(cert_errors::kEkuNotPresent);
    } else if (eku_oid_count != 1 || !has_rcs_mls_client_eku) {
      errors->AddError(cert_errors::kEkuIncorrectForRcsMlsClient);
    }
    return;
  }

  if (required_key_purpose == KeyPurpose::C2PA_TIMESTAMPING) {
    // https://c2pa.org/specifications/specifications/2.1/specs/C2PA_Specification.html#_certificate_profiles
    // For time stamp signing, C2PA requires that the leaf:
    // 1) must have EKU
    // 2) must not have EKU ANY, OCSP signing, document signing, or email protection
    // 3) must have time stamping
    // 4) should tolerate other EKU's being present.
    if (is_target_cert) {
      if (!cert.has_extended_key_usage()) {
        errors->AddError(cert_errors::kEkuNotPresent);
      }
      if (has_any_eku || has_ocsp_signing_eku || has_document_signing_eku ||
          has_email_protection_eku || !has_time_stamping_eku) {
        errors->AddError(cert_errors::kEkuIncorrectForC2PATimeStamping);
      }
    }
    return;
  }

  if (required_key_purpose == KeyPurpose::C2PA_MANIFEST) {
    // https://c2pa.org/specifications/specifications/2.1/specs/C2PA_Specification.html#_certificate_profiles
    // For manifest signing, C2PA requires that the leaf:
    // 1) must have EKU
    // 2) must not have EKU ANY, time stamping, or OCSP signing
    // 3) should have document signing and/or email protection
    // 4) should tolerate other EKU's being present.
    if (is_target_cert) {
      if (!cert.has_extended_key_usage()) {
        errors->AddError(cert_errors::kEkuNotPresent);
      }
      if (!cert.has_key_usage() ||
          !cert.key_usage().AssertsBit(KEY_USAGE_BIT_DIGITAL_SIGNATURE) ||
          has_any_eku || has_ocsp_signing_eku || has_time_stamping_eku ||
          (!has_email_protection_eku && !has_document_signing_eku)) {
        errors->AddError(cert_errors::kEkuIncorrectForC2PAManifest);
      }
    }
    return;
  }

  // Rules TLS client and server authentication variants.

  // Apply strict only to leaf certificates in these cases.
  if (required_key_purpose == KeyPurpose::CLIENT_AUTH_STRICT_LEAF) {
    if (!is_target_cert) {
      required_key_purpose = KeyPurpose::CLIENT_AUTH;
    } else {
      required_key_purpose = KeyPurpose::CLIENT_AUTH_STRICT;
    }
  }

  if (required_key_purpose == KeyPurpose::SERVER_AUTH_STRICT_LEAF) {
    if (!is_target_cert) {
      required_key_purpose = KeyPurpose::SERVER_AUTH;
    } else {
      required_key_purpose = KeyPurpose::SERVER_AUTH_STRICT;
    }
  }

  auto add_error_if_strict = [&](CertErrorId id) {
    if (required_key_purpose == KeyPurpose::SERVER_AUTH_STRICT ||
        required_key_purpose == KeyPurpose::CLIENT_AUTH_STRICT) {
      errors->AddError(id);
    } else {
      errors->AddWarning(id);
    }
  };
  if (is_target_cert) {
    // Loosely based upon CABF BR version 1.8.4, 7.1.2.3(f).  We are more
    // permissive in that we still allow EKU any to be present in a leaf
    // certificate, but we ignore it for purposes of server or client auth.  We
    // are less permissive in that we prohibit Code Signing, OCSP Signing, and
    // Time Stamping which are currently only a SHOULD NOT. The BR does
    // explicitly allow Email authentication to be present, as this still exists
    // in the wild (2022), so we do not prohibit Email authentication here (and
    // by extension must allow it to be present in the signer, below).
    if (!cert.has_extended_key_usage()) {
      // This is added as a warning, an error will be added in STRICT modes
      // if we then lack client or server auth due to this not being present.
      errors->AddWarning(cert_errors::kEkuNotPresent);
    } else {
      if (has_code_signing_eku) {
        add_error_if_strict(cert_errors::kEkuHasProhibitedCodeSigning);
      }
      if (has_ocsp_signing_eku) {
        add_error_if_strict(cert_errors::kEkuHasProhibitedOCSPSigning);
      }
      if (has_time_stamping_eku) {
        add_error_if_strict(cert_errors::kEkuHasProhibitedTimeStamping);
      }
    }
  } else if (is_target_cert_issuer) {
    // Handle the decision to overload EKU as a constraint on issuers.
    //
    // CABF BR version 1.8.4, 7.1.2.2(g) pertains to the case of "Certs used to
    // issue TLS certificates", While the BR refers to the entire chain of
    // intermediates, there are a number of exceptions regarding CA ownership
    // and cross signing which are impossible for us to know or enforce here.
    // Therefore, we can only enforce at the level of the intermediate that
    // issued our target certificate. This means we we differ in the following
    // ways:
    // - We only enforce at the issuer of the TLS certificate.
    // - We allow email protection to exist in the issuer, since without
    //   this it can not be allowed in the client (other than via EKU any))
    // - As in the leaf certificate case, we allow EKU any to be present, but
    //   we ignore it for the purposes of server or client auth.
    //
    // At this time (until at least 2023) some intermediates are lacking EKU in
    // the world at large from common CA's, so we allow the noEKU case to permit
    // everything.
    // TODO(bbe): enforce requiring EKU in the issuer when we can manage it.
    if (cert.has_extended_key_usage()) {
      if (has_code_signing_eku) {
        add_error_if_strict(cert_errors::kEkuHasProhibitedCodeSigning);
      }
      if (has_time_stamping_eku) {
        add_error_if_strict(cert_errors::kEkuHasProhibitedTimeStamping);
      }
    }
  }
  // Otherwise, we are a parent of an issuer of a TLS certificate.  The CABF
  // BR version 1.8.4, 7.1.2.2(g) goes as far as permitting EKU any in certain
  // cases of Cross Signing and CA Ownership, having permitted cases where EKU
  // is permitted to not be present at all. These cases are not practical to
  // differentiate here and therefore we don't attempt to enforce any further
  // EKU "constraints" on such certificates. Unlike the above cases we also
  // allow the use of EKU any for client or server auth constraint purposes.

  switch (required_key_purpose) {
    case KeyPurpose::ANY_EKU:
    case KeyPurpose::CLIENT_AUTH_STRICT_LEAF:
    case KeyPurpose::SERVER_AUTH_STRICT_LEAF:
    case KeyPurpose::RCS_MLS_CLIENT_AUTH:
    case KeyPurpose::C2PA_TIMESTAMPING:
    case KeyPurpose::C2PA_MANIFEST:
      assert(0);  // NOTREACHED
      return;
    case KeyPurpose::SERVER_AUTH:
    case KeyPurpose::SERVER_AUTH_STRICT: {
      if (has_any_eku && !has_server_auth_eku) {
        if (is_target_cert || is_target_cert_issuer) {
          errors->AddWarning(cert_errors::kEkuLacksServerAuthButHasAnyEKU);
        } else {
          // Accept anyEKU for server auth below target issuer.
          has_server_auth_eku = true;
        }
      }
      if (is_target_cert_issuer && !cert.has_extended_key_usage()) {
        // Accept noEKU for server auth in target issuer.
        // TODO(bbe): remove this once BR requirements catch up with CA's.
        has_server_auth_eku = true;
      }
      if (required_key_purpose == KeyPurpose::SERVER_AUTH) {
        // Legacy compatible.
        if (cert.has_extended_key_usage() && !has_server_auth_eku &&
            !has_any_eku) {
          errors->AddError(cert_errors::kEkuLacksServerAuth);
        }
      } else {
        if (!has_server_auth_eku) {
          errors->AddError(cert_errors::kEkuLacksServerAuth);
        }
      }
      break;
    }
    case KeyPurpose::CLIENT_AUTH:
    case KeyPurpose::CLIENT_AUTH_STRICT: {
      if (has_any_eku && !has_client_auth_eku) {
        if (is_target_cert || is_target_cert_issuer) {
          errors->AddWarning(cert_errors::kEkuLacksClientAuthButHasAnyEKU);
        } else {
          // accept anyEKU for client auth.
          has_client_auth_eku = true;
        }
      }
      if (required_key_purpose == KeyPurpose::CLIENT_AUTH) {
        // Legacy-compatible.
        if (cert.has_extended_key_usage() && !has_client_auth_eku &&
            !has_any_eku) {
          errors->AddError(cert_errors::kEkuLacksClientAuth);
        }
      } else {
        if (!has_client_auth_eku) {
          errors->AddError(cert_errors::kEkuLacksClientAuth);
        }
      }
      break;
    }
  }
}